

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<bool>::Reserve(RepeatedField<bool> *this,int new_size)

{
  Arena *this_00;
  bool *pbVar1;
  bool *pbVar2;
  void **ppvVar3;
  LogMessage *pLVar4;
  undefined8 *puVar5;
  ulong n;
  uint uVar6;
  LogMessage local_a8;
  LogMessage local_70;
  LogFinisher local_31;
  
  if (this->total_size_ < new_size) {
    if (this->total_size_ < 1) {
      pbVar1 = (bool *)0x0;
    }
    else {
      pbVar1 = elements(this);
      pbVar1 = pbVar1 + -8;
    }
    if (this->total_size_ == 0) {
      ppvVar3 = &this->arena_or_elements_;
    }
    else {
      pbVar2 = elements(this);
      ppvVar3 = (void **)(pbVar2 + -8);
    }
    this_00 = (Arena *)*ppvVar3;
    uVar6 = 4;
    if (3 < new_size) {
      if (this->total_size_ < 0x40000000) {
        uVar6 = this->total_size_ * 2;
        if ((int)uVar6 <= new_size) {
          uVar6 = new_size;
        }
      }
      else {
        if (new_size < 0x40000001) {
          internal::LogMessage::LogMessage
                    (&local_a8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
                     ,0x602);
          pLVar4 = internal::LogMessage::operator<<
                             (&local_a8,
                              "CHECK failed: (new_size) > (kRepeatedFieldUpperClampLimit): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar4);
          internal::LogMessage::~LogMessage(&local_a8);
        }
        uVar6 = 0x7fffffff;
      }
    }
    if (0xfffffff7 < uVar6) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
                 ,0x613);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (static_cast<size_t>(new_size)) <= ((std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element)): "
                         );
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,"Requested size is too large to fit into size_t.");
      internal::LogFinisher::operator=(&local_31,pLVar4);
      internal::LogMessage::~LogMessage(&local_70);
    }
    if (this_00 == (Arena *)0x0) {
      puVar5 = (undefined8 *)operator_new((long)(int)uVar6 + 8);
    }
    else {
      n = (long)(int)uVar6 + 0xfU & 0xfffffffffffffff8;
      if (this_00->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(this_00,(type_info *)&char::typeinfo,n);
      }
      puVar5 = (undefined8 *)Arena::AllocateAlignedNoHook(this_00,n);
    }
    *puVar5 = this_00;
    this->total_size_ = uVar6;
    this->arena_or_elements_ = puVar5 + 1;
    elements(this);
    if (0 < this->current_size_) {
      pbVar2 = elements(this);
      memcpy(pbVar2,pbVar1 + 8,(long)this->current_size_);
    }
    if ((pbVar1 != (bool *)0x0) && (*(long *)pbVar1 == 0)) {
      operator_delete(pbVar1);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : NULL;
  Rep* new_rep;
  Arena* arena = GetArena();
  new_size = internal::CalculateReserveSize(total_size_, new_size);
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == NULL) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  // Already known: new_size >= internal::kMinRepeatedFieldAllocationSize
  // Maintain invariant:
  //     total_size_ == 0 ||
  //     total_size_ >= internal::kMinRepeatedFieldAllocationSize
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}